

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDFace::GetCornerEdges
          (ON_SubDFace *this,ON_SubDVertex *corner_vertex,ON_SubDEdgePtr *entering_edge,
          ON_SubDEdgePtr *leaving_edge)

{
  bool bVar1;
  uint uVar2;
  uint i;
  ON_SubDEdgePtr OVar3;
  bool local_51;
  uint fvi;
  uint edge_count;
  ON_SubDEdgePtr *leaving_edge_local;
  ON_SubDEdgePtr *entering_edge_local;
  ON_SubDVertex *corner_vertex_local;
  ON_SubDFace *this_local;
  
  uVar2 = EdgeCount(this);
  if (((uVar2 < 3) || (corner_vertex == (ON_SubDVertex *)0x0)) ||
     (i = VertexIndex(this,corner_vertex), uVar2 <= i)) {
    entering_edge->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
    leaving_edge->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
    this_local._4_4_ = 0xffffffff;
  }
  else {
    OVar3 = EdgePtr(this,((i + uVar2) - 1) % uVar2);
    entering_edge->m_ptr = (ON__UINT_PTR)OVar3;
    OVar3 = EdgePtr(this,i);
    leaving_edge->m_ptr = (ON__UINT_PTR)OVar3;
    bVar1 = ON_SubDEdgePtr::IsNotNull(entering_edge);
    local_51 = false;
    if (bVar1) {
      local_51 = ON_SubDEdgePtr::IsNotNull(leaving_edge);
    }
    this_local._4_4_ = (uint)local_51;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int  ON_SubDFace::GetCornerEdges(
  const ON_SubDVertex* corner_vertex,
  ON_SubDEdgePtr& entering_edge,
  ON_SubDEdgePtr& leaving_edge
) const
{
  for (;;)
  {
    const unsigned edge_count = this->EdgeCount();
    if (edge_count < 3)
      break;
    if (nullptr == corner_vertex)
      break;
    const unsigned fvi = this->VertexIndex(corner_vertex);
    if (fvi >= edge_count)
      break;
    entering_edge = this->EdgePtr((fvi + edge_count - 1) % edge_count);
    leaving_edge = this->EdgePtr(fvi);
    return entering_edge.IsNotNull() && leaving_edge.IsNotNull();
  }
  entering_edge = ON_SubDEdgePtr::Null;
  leaving_edge = ON_SubDEdgePtr::Null;
  return ON_UNSET_UINT_INDEX;
}